

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

void __thiscall CoreML::FeatureType::FeatureType(FeatureType *this,MLFeatureTypeType type)

{
  ArrayFeatureType *this_00;
  FeatureType *this_01;
  undefined1 local_19;
  
  (this->m_type).super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CoreML::Specification::FeatureType,std::allocator<CoreML::Specification::FeatureType>>
            (&(this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FeatureType **)this,
             (allocator<CoreML::Specification::FeatureType> *)&local_19);
  switch(type) {
  case MLFeatureTypeType_int64Type:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 1) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 1;
    this_00 = (ArrayFeatureType *)operator_new(0x18);
    Specification::Int64FeatureType::Int64FeatureType((Int64FeatureType *)this_00);
    break;
  case MLFeatureTypeType_doubleType:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 2) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 2;
    this_00 = (ArrayFeatureType *)operator_new(0x18);
    Specification::DoubleFeatureType::DoubleFeatureType((DoubleFeatureType *)this_00);
    break;
  case MLFeatureTypeType_stringType:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 3) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 3;
    this_00 = (ArrayFeatureType *)operator_new(0x18);
    Specification::StringFeatureType::StringFeatureType((StringFeatureType *)this_00);
    break;
  case MLFeatureTypeType_imageType:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 4) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 4;
    this_00 = (ArrayFeatureType *)operator_new(0x38);
    Specification::ImageFeatureType::ImageFeatureType((ImageFeatureType *)this_00);
    break;
  case MLFeatureTypeType_multiArrayType:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 5) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 5;
    this_00 = (ArrayFeatureType *)operator_new(0x48);
    Specification::ArrayFeatureType::ArrayFeatureType(this_00);
    break;
  case MLFeatureTypeType_dictionaryType:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 6) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 6;
    this_00 = (ArrayFeatureType *)operator_new(0x20);
    Specification::DictionaryFeatureType::DictionaryFeatureType((DictionaryFeatureType *)this_00);
    break;
  case MLFeatureTypeType_sequenceType:
    this_01 = (this->m_type).
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01->_oneof_case_[0] == 7) {
      return;
    }
    Specification::FeatureType::clear_Type(this_01);
    this_01->_oneof_case_[0] = 7;
    this_00 = (ArrayFeatureType *)operator_new(0x28);
    Specification::SequenceFeatureType::SequenceFeatureType((SequenceFeatureType *)this_00);
    break;
  default:
    goto switchD_00528639_default;
  }
  (this_01->Type_).sequencetype_ = (SequenceFeatureType *)this_00;
switchD_00528639_default:
  return;
}

Assistant:

FeatureType::FeatureType(MLFeatureTypeType type)
    : m_type(std::make_shared<Specification::FeatureType>()) {
        switch (type) {
            case MLFeatureTypeType_NOT_SET:
                break;
            case MLFeatureTypeType_multiArrayType:
                m_type->mutable_multiarraytype();
                break;
            case MLFeatureTypeType_imageType:
                m_type->mutable_imagetype();
                break;
            case MLFeatureTypeType_int64Type:
                m_type->mutable_int64type();
                break;
            case MLFeatureTypeType_doubleType:
                m_type->mutable_doubletype();
                break;
            case MLFeatureTypeType_stringType:
                m_type->mutable_stringtype();
                break;
            case MLFeatureTypeType_dictionaryType:
                m_type->mutable_dictionarytype();
                break;
            case MLFeatureTypeType_sequenceType:
                m_type->mutable_sequencetype();
                break;
        }
    }